

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

void luaT_init(lua_State *L)

{
  TString *pTVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pTVar1 = luaS_new(L,(char *)((long)&_ZZ9luaT_initP9lua_StateE14luaT_eventname_rel +
                                (long)*(int *)((long)&_ZZ9luaT_initP9lua_StateE14luaT_eventname_rel
                                              + lVar2)));
    *(TString **)((long)L->l_G->tmname + lVar2 * 2) = pTVar1;
    luaC_fix(L,*(GCObject **)((long)L->l_G->tmname + lVar2 * 2));
    lVar2 = lVar2 + 4;
  } while (lVar2 != 100);
  return;
}

Assistant:

void luaT_init (lua_State *L) {
  static const char *const luaT_eventname[] = {  /* ORDER TM */
    "__index", "__newindex",
    "__gc", "__mode", "__len", "__eq",
    "__add", "__sub", "__mul", "__mod", "__pow",
    "__div", "__idiv",
    "__band", "__bor", "__bxor", "__shl", "__shr",
    "__unm", "__bnot", "__lt", "__le",
    "__concat", "__call", "__close"
  };
  int i;
  for (i=0; i<TM_N; i++) {
    G(L)->tmname[i] = luaS_new(L, luaT_eventname[i]);
    luaC_fix(L, obj2gco(G(L)->tmname[i]));  /* never collect these names */
  }
}